

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_cursor.hpp
# Opt level: O2

void __thiscall
jsoncons::csv::basic_csv_cursor<char,jsoncons::string_source<char>,std::allocator<char>>::
basic_csv_cursor<std::__cxx11::string&>
          (basic_csv_cursor<char,jsoncons::string_source<char>,std::allocator<char>> *this,
          allocator<char> *param_2,undefined8 *param_3,basic_csv_decode_options<char> *param_4,
          function<bool_(jsoncons::csv::csv_errc,_const_jsoncons::ser_context_&)> *param_5,
          error_code *param_6)

{
  string_view_type sv;
  function<bool_(jsoncons::csv::csv_errc,_const_jsoncons::ser_context_&)> local_50;
  
  *(undefined8 *)this = 0x99cca8;
  *(undefined8 *)(this + 0x288) = 0x99cd48;
  *(undefined8 *)(this + 0x18) = 0;
  *(undefined8 *)(this + 8) = 0;
  *(undefined8 *)(this + 0x10) = 0;
  this[0x20] = (basic_csv_cursor<char,jsoncons::string_source<char>,std::allocator<char>>)0x1;
  std::function<bool_(jsoncons::csv::csv_errc,_const_jsoncons::ser_context_&)>::function
            (&local_50,param_5);
  basic_csv_parser<char,_std::allocator<char>_>::basic_csv_parser
            ((basic_csv_parser<char,_std::allocator<char>_> *)(this + 0x28),param_4,&local_50,
             param_2);
  std::_Function_base::~_Function_base(&local_50.super__Function_base);
  *(undefined ***)(this + 0x228) = &PTR__basic_json_visitor_00998270;
  *(undefined2 *)(this + 0x230) = 3;
  *(undefined4 *)(this + 600) = 0;
  *(undefined8 *)(this + 0x238) = 0;
  *(undefined8 *)(this + 0x240) = 0;
  *(undefined8 *)(this + 0x244) = 0;
  *(undefined8 *)(this + 0x24c) = 0;
  *(undefined8 *)(this + 0x260) = 0;
  *(undefined8 *)(this + 0x268) = 0;
  *(undefined8 *)(this + 0x280) = 0;
  *(undefined8 *)(this + 0x270) = 0;
  *(undefined8 *)(this + 0x278) = 0;
  this[0x101] = (basic_csv_cursor<char,jsoncons::string_source<char>,std::allocator<char>>)0x1;
  this[0x100] = (basic_csv_cursor<char,jsoncons::string_source<char>,std::allocator<char>>)
                (this[0x7c] !=
                (basic_csv_cursor<char,jsoncons::string_source<char>,std::allocator<char>>)0x3);
  sv._M_str = (char *)*param_3;
  sv._M_len = param_3[1];
  basic_csv_cursor<char,_jsoncons::string_source<char>,_std::allocator<char>_>::
  initialize_with_string_view
            ((basic_csv_cursor<char,_jsoncons::string_source<char>,_std::allocator<char>_> *)this,sv
             ,param_6);
  return;
}

Assistant:

basic_csv_cursor(std::allocator_arg_t, const Allocator& alloc, 
        Sourceable&& source, 
        const basic_csv_decode_options<CharT>& options,
        std::function<bool(csv_errc,const ser_context&)> err_handler,
        std::error_code& ec,
        typename std::enable_if<std::is_constructible<jsoncons::basic_string_view<CharT>,Sourceable>::value>::type* = 0)
       : source_(),
         parser_(options,err_handler,alloc)
    {
        parser_.cursor_mode(true);
        jsoncons::basic_string_view<CharT> sv(std::forward<Sourceable>(source));
        initialize_with_string_view(sv, ec);
    }